

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void MapOptHandler_PrecacheTextures(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FString FStack_28;
  
  FMapInfoParser::ParseAssign(parse);
  do {
    FScanner::MustGetString(&parse->sc);
    FString::FString(&FStack_28,(parse->sc).String);
    TArray<FString,_FString>::Push(&info->PrecacheTextures,&FStack_28);
    FString::~FString(&FStack_28);
    bVar1 = FScanner::CheckString(&parse->sc,",");
  } while (bVar1);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheTextures, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		//the texture manager is not initialized here so all we can do is store the texture's name.
		info->PrecacheTextures.Push(parse.sc.String);
	} while (parse.sc.CheckString(","));
}